

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

_Bool AArch64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  uint8_t *puVar2;
  uint uVar3;
  DecodeStatus DVar4;
  uint8_t *orig_p;
  long lVar5;
  byte bVar6;
  uint uVar7;
  uint64_t Address;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *orig_p_2;
  uint8_t *puVar11;
  ulong uVar12;
  byte *pbVar13;
  uint64_t Value_4;
  uint8_t *orig_p_1;
  DecodeStatus local_3c;
  
  if (3 < code_len) {
    __s = instr->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
      lVar5 = 0x38;
      do {
        puVar2 = instr->flat_insn->detail->regs_read + lVar5;
        puVar2[0] = 0xff;
        puVar2[1] = 0xff;
        puVar2[2] = 0xff;
        puVar2[3] = 0xff;
        lVar5 = lVar5 + 0x30;
      } while (lVar5 != 0x1b8);
    }
    uVar3 = (uint)code[3];
    if (*(char *)(ud + 0x28) == '\x01') {
      uVar7 = (uint)*code << 0x18 | (uint)code[1] << 0x10 | (uint)code[2] << 8;
    }
    else {
      uVar3 = (uint)code[1] << 8 | (uint)code[2] << 0x10 | (uint)code[3] << 0x18;
      uVar7 = (uint)*code;
    }
    uVar7 = uVar7 | uVar3;
    uVar3 = 0;
    local_3c = MCDisassembler_Success;
    Address = 0xffffffff;
    puVar2 = DecoderTable32;
LAB_001690d0:
    puVar11 = puVar2;
    switch(*puVar11) {
    case '\x01':
      uVar3 = ~(-1 << (puVar11[2] & 0x1f)) << (puVar11[1] & 0x1f);
      if (puVar11[2] == 0x20) {
        uVar3 = 0xffffffff;
      }
      uVar3 = (uVar3 & uVar7) >> (puVar11[1] & 0x1f);
      puVar2 = puVar11 + 3;
      goto LAB_001690d0;
    case '\x02':
      uVar10 = 0;
      address = 0;
      bVar6 = 0;
      do {
        lVar5 = uVar10 + 1;
        address = address + ((puVar11[lVar5] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar5] < '\0');
      puVar2 = puVar11 + (uVar10 & 0xffffffff) + 3;
      if (uVar3 != (uint)address) {
        puVar2 = puVar11 + (uVar10 & 0xffffffff) + 3 +
                 *(ushort *)(puVar11 + (uVar10 & 0xffffffff) + 1);
      }
      goto LAB_001690d0;
    case '\x03':
      uVar9 = ~(-1 << (puVar11[2] & 0x1f)) << (puVar11[1] & 0x1f);
      uVar10 = 0;
      address = 0;
      bVar6 = 0;
      do {
        lVar5 = uVar10 + 3;
        address = address + ((puVar11[lVar5] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar5] < '\0');
      if (puVar11[2] == 0x20) {
        uVar9 = 0xffffffff;
      }
      puVar2 = puVar11 + (uVar10 & 0xffffffff) + 5;
      if ((uVar9 & uVar7) >> (puVar11[1] & 0x1f) != (uint)address) {
        puVar2 = puVar11 + (uVar10 & 0xffffffff) + 5 +
                 *(ushort *)(puVar11 + (uVar10 & 0xffffffff) + 3);
      }
      goto LAB_001690d0;
    case '\x04':
      uVar10 = 0;
      do {
        lVar5 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar5] < '\0');
      puVar2 = puVar11 + (uVar10 & 0xffffffff) + 3;
      goto LAB_001690d0;
    case '\x05':
      uVar10 = 0;
      uVar3 = 0;
      bVar6 = 0;
      do {
        lVar5 = uVar10 + 1;
        uVar3 = uVar3 + ((puVar11[lVar5] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar5] < '\0');
      pbVar13 = puVar11 + (uVar10 & 0xffffffff) + 1;
      uVar9 = 0;
      bVar6 = 0;
      do {
        bVar1 = *pbVar13;
        uVar9 = uVar9 + ((bVar1 & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        pbVar13 = pbVar13 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(instr,uVar3);
      DVar4 = decodeToMCInst(local_3c,uVar9,uVar7,instr,Address,(void *)address);
LAB_001692db:
      if (DVar4 != MCDisassembler_Fail) {
        *size = 4;
        return DVar4 == MCDisassembler_Success;
      }
      MCInst_clear(instr);
      break;
    case '\x06':
      uVar10 = 0;
      uVar9 = 0;
      bVar6 = 0;
      do {
        lVar5 = uVar10 + 1;
        uVar9 = uVar9 + ((puVar11[lVar5] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar5] < '\0');
      uVar12 = 0;
      uVar8 = 0;
      bVar6 = 0;
      do {
        lVar5 = uVar12 + (uVar10 & 0xffffffff) + 1;
        uVar8 = uVar8 + ((puVar11[lVar5] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar11[lVar5] < '\0');
      uVar9 = uVar8 & ~uVar7 | uVar9 & uVar7;
      address = (uint64_t)uVar9;
      puVar2 = puVar11 + (uVar12 & 0xffffffff) + (uVar10 & 0xffffffff) + 1;
      if (uVar9 != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      goto LAB_001690d0;
    default:
      DVar4 = MCDisassembler_Fail;
      goto LAB_001692db;
    }
  }
  *size = 0;
  return false;
}

Assistant:

bool AArch64_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _getInstruction((cs_struct *)ud, instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}